

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O3

int Cec_ManSimClassRemoveOne(Cec_ManSim_t *p,int i)

{
  Gia_Man_t *pGVar1;
  Gia_Rpr_t *pGVar2;
  uint uVar3;
  
  pGVar1 = p->pAig;
  pGVar2 = pGVar1->pReprs;
  uVar3 = (uint)pGVar2[i] & 0xfffffff;
  if (uVar3 == 0xfffffff) {
    if (pGVar1->pNexts[i] < 1) {
      return 0;
    }
  }
  else if (uVar3 == 0) {
    pGVar2[i] = (Gia_Rpr_t)((uint)pGVar2[i] | 0xfffffff);
    return 1;
  }
  if (uVar3 == 0xfffffff) {
    uVar3 = i;
  }
  p->vClassOld->nSize = 0;
  p->vClassNew->nSize = 0;
  if (((~(uint)pGVar2[(int)uVar3] & 0xfffffff) == 0) && (0 < pGVar1->pNexts[(int)uVar3])) {
    if (uVar3 != 0) {
      do {
        Vec_IntPush((&p->vClassOld)[uVar3 == i],uVar3);
        uVar3 = p->pAig->pNexts[(int)uVar3];
      } while (uVar3 != 0);
      if (p->vClassNew->nSize == 1) {
        Cec_ManSimClassCreate(p->pAig,p->vClassOld);
        Cec_ManSimClassCreate(p->pAig,p->vClassNew);
        uVar3 = (uint)p->pAig->pReprs[i] & 0xfffffff;
        if (((uVar3 == 0xfffffff) || (uVar3 == 0)) && (p->pAig->pNexts[i] < 1)) {
          return 1;
        }
        __assert_fail("!Gia_ObjIsClass(p->pAig, i)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                      ,0x14f,"int Cec_ManSimClassRemoveOne(Cec_ManSim_t *, int)");
      }
    }
    __assert_fail("Vec_IntSize( p->vClassNew ) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                  ,0x14c,"int Cec_ManSimClassRemoveOne(Cec_ManSim_t *, int)");
  }
  __assert_fail("Gia_ObjIsHead(p->pAig, iRepr)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                ,0x145,"int Cec_ManSimClassRemoveOne(Cec_ManSim_t *, int)");
}

Assistant:

int Cec_ManSimClassRemoveOne( Cec_ManSim_t * p, int i )
{
    int iRepr, Ent;
    if ( Gia_ObjIsConst(p->pAig, i) )
    {
        Gia_ObjSetRepr( p->pAig, i, GIA_VOID );
        return 1;
    }
    if ( !Gia_ObjIsClass(p->pAig, i) )
        return 0;
    assert( Gia_ObjIsClass(p->pAig, i) );
    iRepr = Gia_ObjRepr( p->pAig, i );
    if ( iRepr == GIA_VOID )
        iRepr = i;
    // collect nodes
    Vec_IntClear( p->vClassOld );
    Vec_IntClear( p->vClassNew );
    Gia_ClassForEachObj( p->pAig, iRepr, Ent )
    {
        if ( Ent == i )
            Vec_IntPush( p->vClassNew, Ent );
        else
            Vec_IntPush( p->vClassOld, Ent );
    }
    assert( Vec_IntSize( p->vClassNew ) == 1 );
    Cec_ManSimClassCreate( p->pAig, p->vClassOld );
    Cec_ManSimClassCreate( p->pAig, p->vClassNew );
    assert( !Gia_ObjIsClass(p->pAig, i) );
    return 1;
}